

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_scas(DisasContext *s,MemOp ot)

{
  MemOp ot_00;
  TCGv_i64 addr;
  TCGv_i64 val;
  TCGContext *pTVar1;
  TCGArg a2;
  TCGTemp *ts;
  
  gen_lea_v_seg(s,s->aflag,s->uc->tcg_ctx->cpu_regs[7],0,-1);
  addr = s->A0;
  val = s->T1;
  pTVar1 = s->uc->tcg_ctx;
  if (s->uc->hook[10].head != (list_item *)0x0) {
    a2 = s->prev_pc;
    ts = tcg_temp_new_internal_x86_64(pTVar1,TCG_TYPE_I64,false);
    tcg_gen_op2_x86_64(pTVar1,INDEX_op_movi_i64,(TCGArg)ts,a2);
    tcg_gen_op3_x86_64(pTVar1,INDEX_op_st_i64,(TCGArg)ts,(TCGArg)(pTVar1->cpu_env + (long)pTVar1),
                       0x80);
    tcg_temp_free_internal_x86_64(pTVar1,ts);
  }
  tcg_gen_qemu_ld_i64_x86_64(pTVar1,val,addr,(long)s->mem_index,ot);
  gen_op(s,7,ot,0);
  pTVar1 = s->uc->tcg_ctx;
  tcg_gen_op3_x86_64(pTVar1,INDEX_op_ld32s_i64,(TCGArg)(s->T0 + (long)pTVar1),
                     (TCGArg)(pTVar1->cpu_env + (long)pTVar1),0xac);
  tcg_gen_shli_i64_x86_64(pTVar1,s->T0,s->T0,(ulong)ot);
  ot_00 = s->aflag;
  pTVar1 = s->uc->tcg_ctx;
  tcg_gen_op3_x86_64(pTVar1,INDEX_op_add_i64,(TCGArg)(s->tmp0 + (long)pTVar1),
                     (TCGArg)(pTVar1->cpu_regs[7] + (long)pTVar1),(TCGArg)(s->T0 + (long)pTVar1));
  gen_op_mov_reg_v(s,ot_00,7,s->tmp0);
  return;
}

Assistant:

static inline void gen_scas(DisasContext *s, MemOp ot)
{
    gen_string_movl_A0_EDI(s);
    gen_op_ld_v(s, ot, s->T1, s->A0);
    gen_op(s, OP_CMPL, ot, R_EAX);
    gen_op_movl_T0_Dshift(s, ot);
    gen_op_add_reg_T0(s, s->aflag, R_EDI);
}